

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackPrimitiveTypeCase::iterate
          (FeedbackPrimitiveTypeCase *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  float fVar2;
  undefined8 uVar3;
  TessellationOutputType TVar4;
  TessellationPointMode TVar5;
  GeometryOutputType GVar6;
  RenderContext *pRVar7;
  TestLog *log;
  GLuint GVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  deUint32 dVar12;
  int iVar13;
  __normal_iterator<tcu::Vector<float,_4>_*,_std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>_>
  __i;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar14;
  undefined4 extraout_var_01;
  void *pvVar15;
  ulong uVar16;
  TextureFormat TVar17;
  TextureFormat TVar18;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  RenderTarget *pRVar19;
  TestError *pTVar20;
  int i;
  long lVar21;
  uint uVar22;
  TextureFormat TVar23;
  undefined4 uVar24;
  TextureFormat TVar25;
  TextureFormat TVar26;
  int iVar27;
  TextureFormat TVar28;
  TextureFormat TVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  GLuint primitivesGeneratedResult;
  undefined1 auStack_2a4 [4];
  TextureFormat TStack_2a0;
  ulong local_298;
  Surface feedbackResult;
  Surface nonFeedbackResult;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> feedbackResults;
  VertexArray vao;
  Vec4 generatedElementVertex;
  Query primitivesGeneratedQuery;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [104];
  ios_base local_160 [264];
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  
  TStack_2a0.type = primitivesGeneratedResult._4_4_;
  tcu::Surface::Surface(&feedbackResult,0x80,0x80);
  tcu::Surface::Surface(&nonFeedbackResult,0x80,0x80);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar21 = CONCAT44(extraout_var,iVar11);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar14 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper
            (&vao.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar11),pOVar14);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar14 = glu::objectTraits(OBJECTTYPE_QUERY);
  glu::ObjectWrapper::ObjectWrapper
            (&primitivesGeneratedQuery.super_ObjectWrapper,
             (Functions *)CONCAT44(extraout_var_01,iVar11),pOVar14);
  iVar11 = (**(code **)(lVar21 + 0x780))
                     ((this->m_feedbackProgram->m_program).m_program,"a_position");
  uVar24 = 0xffffffff;
  if ((ulong)this->m_geometryOutputType < 3) {
    uVar24 = *(undefined4 *)(&DAT_0098e8c4 + (ulong)this->m_geometryOutputType * 4);
  }
  if (iVar11 == -1) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    local_1d8._0_8_ = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"a_position was -1","");
    tcu::TestError::TestError(pTVar20,(string *)local_1d8);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Rendering with transform feedback",0x21);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  (**(code **)(lVar21 + 0x1a00))(0,0,feedbackResult.m_width,feedbackResult.m_height);
  (**(code **)(lVar21 + 0x1c0))(0);
  (**(code **)(lVar21 + 0x188))(0x4000);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x412);
  (**(code **)(lVar21 + 0xd8))(vao.super_ObjectWrapper.m_object);
  (**(code **)(lVar21 + 0x40))(0x8892,this->m_patchBuffer);
  (**(code **)(lVar21 + 0x19f0))(iVar11,4,0x1406,0,0,0);
  (**(code **)(lVar21 + 0x610))(iVar11);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"setup attribs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x418);
  (**(code **)(lVar21 + 0x1680))((this->m_feedbackProgram->m_program).m_program);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x41b);
  (**(code **)(lVar21 + 0xfd8))(0x8e72,4);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"set patch param",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x41e);
  (**(code **)(lVar21 + 0x20))(0x8c87,primitivesGeneratedQuery.super_ObjectWrapper.m_object);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"begin GL_PRIMITIVES_GENERATED query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x421);
  local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Begin transform feedback with mode ",0x23);
  TStack_2a0.order = uVar24;
  _primitivesGeneratedResult = (TextureFormat)glu::getPrimitiveTypeName;
  tcu::Format::Enum<int,_2UL>::toStream
            ((Enum<int,_2UL> *)&primitivesGeneratedResult,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  (**(code **)(lVar21 + 0x30))(uVar24);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"begin xfb",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x426);
  local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Calling drawArrays with mode GL_PATCHES",0x27);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  (**(code **)(lVar21 + 0x538))(0xe,0,4);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"draw patches",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x42b);
  (**(code **)(lVar21 + 0x638))();
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"end xfb",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x42e);
  (**(code **)(lVar21 + 0x628))(0x8c87);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"end GL_PRIMITIVES_GENERATED query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x431);
  pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
  _primitivesGeneratedResult = (TextureFormat)0x300000008;
  pvVar15 = (void *)feedbackResult.m_pixels.m_cap;
  if (feedbackResult.m_pixels.m_cap != 0) {
    pvVar15 = feedbackResult.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1d8,(TextureFormat *)&primitivesGeneratedResult,
             feedbackResult.m_width,feedbackResult.m_height,1,pvVar15);
  glu::readPixels(pRVar7,0,0,(PixelBufferAccess *)local_1d8);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"readPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x434);
  auVar40._12_4_ = 0;
  auVar40._0_12_ = _auStack_2a4;
  _primitivesGeneratedResult = (Enum<int,_2UL>)(auVar40 << 0x20);
  (**(code **)(lVar21 + 0xa20))(primitivesGeneratedQuery.super_ObjectWrapper.m_object,0x8866);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"get GL_PRIMITIVES_GENERATED value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x43a);
  local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying GL_PRIMITIVES_GENERATED, expecting ",0x2d);
  TVar4 = this->m_tessellationOutput;
  TVar5 = this->m_tessellationPointMode;
  iVar11 = getNumTessellatedPrimitives((FeedbackPrimitiveTypeCase *)(ulong)TVar4);
  uVar22 = 1;
  if (TVar5 == TESSELLATION_POINTMODE_OFF) {
    uVar22 = TVar4 == TESSELLATION_OUT_ISOLINES ^ 3;
  }
  std::ostream::operator<<
            (poVar1,(uVar22 << (this->m_geometryOutputType == GEOMETRY_OUTPUT_LINES)) * iVar11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  GVar8 = primitivesGeneratedResult;
  TVar4 = this->m_tessellationOutput;
  TVar5 = this->m_tessellationPointMode;
  iVar11 = getNumTessellatedPrimitives((FeedbackPrimitiveTypeCase *)(ulong)TVar4);
  uVar22 = 1;
  if (TVar5 == TESSELLATION_POINTMODE_OFF) {
    uVar22 = TVar4 == TESSELLATION_OUT_ISOLINES ^ 3;
  }
  if (GVar8 == (uVar22 << (this->m_geometryOutputType == GEOMETRY_OUTPUT_LINES)) * iVar11) {
    local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1d8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"GL_PRIMITIVES_GENERATED valid.",0x1e);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_160);
  }
  else {
    local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1d8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Error, GL_PRIMITIVES_GENERATED was ",0x23);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_160);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Got unexpected GL_PRIMITIVES_GENERATED");
  }
  GVar6 = this->m_geometryOutputType;
  iVar11 = -1;
  if (GVar6 < GEOMETRY_OUTPUT_LAST) {
    iVar11 = GVar6 + GEOMETRY_OUTPUT_LINES;
  }
  TVar4 = this->m_tessellationOutput;
  TVar5 = this->m_tessellationPointMode;
  iVar13 = getNumTessellatedPrimitives((FeedbackPrimitiveTypeCase *)(ulong)TVar4);
  uVar22 = 1;
  if (TVar5 == TESSELLATION_POINTMODE_OFF) {
    uVar22 = TVar4 == TESSELLATION_OUT_ISOLINES ^ 3;
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&feedbackResults,
             (long)(int)(iVar13 * iVar11 * (uVar22 << (GVar6 == GEOMETRY_OUTPUT_LINES))),
             (allocator_type *)local_1d8);
  pvVar15 = (void *)(**(code **)(lVar21 + 0xd00))
                              (0x8c8e,0,CONCAT44(feedbackResults.
                                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                                 (int)feedbackResults.
                                                                                                            
                                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) -
                                        (long)feedbackResults.
                                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,1);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"mapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x44d);
  local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Reading transform feedback buffer.",0x22);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  if (pvVar15 == (void *)0x0) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    local_1d8._0_8_ = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"mapBufferRange returned null","");
    tcu::TestError::TestError(pTVar20,(string *)local_1d8);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  memcpy(feedbackResults.
         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
         super__Vector_impl_data._M_start,pvVar15,
         (long)((int)feedbackResults.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (int)feedbackResults.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0);
  cVar9 = (**(code **)(lVar21 + 0x1670))(0x8c8e);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"unmapBuffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x456);
  if (cVar9 != '\x01') {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    local_1d8._0_8_ = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1d8,"unmapBuffer failed, did not return true","");
    tcu::TestError::TestError(pTVar20,(string *)local_1d8);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  GVar6 = this->m_geometryOutputType;
  uVar22 = this->m_tessellationOutput == TESSELLATION_OUT_ISOLINES ^ 3;
  iVar11 = 1;
  if (this->m_tessellationPointMode != TESSELLATION_POINTMODE_OFF) {
    uVar22 = 1;
  }
  local_58 = (float)(uVar22 << (GVar6 == GEOMETRY_OUTPUT_LINES));
  bVar10 = true;
  if (GVar6 != GEOMETRY_OUTPUT_POINTS) {
    if (GVar6 == GEOMETRY_OUTPUT_TRIANGLES) {
      iVar11 = 3;
    }
    else if (GVar6 == GEOMETRY_OUTPUT_LINES) {
      iVar11 = 2;
    }
    else {
      iVar11 = -1;
      bVar10 = false;
    }
  }
  local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Verifying feedback results.",0x1b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  iVar13 = getNumTessellatedPrimitives
                     ((FeedbackPrimitiveTypeCase *)(ulong)this->m_tessellationOutput);
  if (0 < iVar13) {
    poVar1 = (ostringstream *)(local_1d8 + 8);
    if (iVar11 < 2) {
      iVar11 = 1;
    }
    iVar27 = 0;
    iVar13 = 0;
    iVar31 = 0;
    do {
      lVar21 = 0;
      do {
        *(float *)(auStack_2a4 + lVar21 * 4 + -4) =
             feedbackResults.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[iVar31].m_data[lVar21];
        lVar21 = lVar21 + 1;
      } while (lVar21 != 4);
      if ((0.40000102 < ABS((float)primitivesGeneratedResult)) ||
         (0.40000102 < ABS((float)auStack_2a4))) {
LAB_0057066d:
        iVar30 = iVar27 + 1;
        if (7 < iVar27) goto LAB_0057077e;
        local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1d8 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Element at index ",0x11);
        std::ostream::operator<<(this_00,iVar31);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," (tessellation invocation ",0x1a);
        std::ostream::operator<<(this_00,iVar13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "\texpected vertex in range: ( [-0.4, 0.4], [-0.4, 0.4], 0.0, 1.0 )\n",0x42);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\tgot: ",6);
        tcu::operator<<((ostream *)this_00,(Vector<float,_4> *)&primitivesGeneratedResult);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_160);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"invalid feedback output");
        iVar31 = iVar31 + 1;
        iVar27 = iVar30;
      }
      else {
        auVar37._0_4_ = -(float)TStack_2a0.order;
        auVar37._4_4_ = 0x80000000;
        auVar37._8_4_ = 0x80000000;
        auVar37._12_4_ = 0x80000000;
        if (auVar37._0_4_ <= (float)TStack_2a0.order) {
          auVar37._0_4_ = (float)TStack_2a0.order;
        }
        if (1e-06 <= auVar37._0_4_) goto LAB_0057066d;
        fVar33 = (float)TStack_2a0.type + -1.0;
        auVar38._0_4_ = -fVar33;
        auVar38._4_4_ = 0x80000000;
        auVar38._8_4_ = 0x80000000;
        auVar38._12_4_ = 0x80000000;
        if (auVar38._0_4_ <= fVar33) {
          auVar38._0_4_ = fVar33;
        }
        iVar30 = iVar27;
        if (1e-06 <= auVar38._0_4_) goto LAB_0057066d;
LAB_0057077e:
        fVar33 = 0.0;
        do {
          if (bVar10) {
            iVar27 = 0;
            do {
              lVar21 = 0;
              do {
                generatedElementVertex.m_data[lVar21] =
                     feedbackResults.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar31].m_data[lVar21];
                lVar21 = lVar21 + 1;
              } while (lVar21 != 4);
              auVar35._0_4_ = (float)primitivesGeneratedResult - generatedElementVertex.m_data[0];
              auVar35._4_4_ = (float)auStack_2a4 - generatedElementVertex.m_data[1];
              auVar35._8_4_ = (float)TStack_2a0.order - generatedElementVertex.m_data[2];
              auVar35._12_4_ = (float)TStack_2a0.type - generatedElementVertex.m_data[3];
              uVar16 = CONCAT44(auVar35._4_4_,auVar35._0_4_);
              auVar39._0_8_ = uVar16 ^ 0x8000000080000000;
              auVar39._8_4_ = -auVar35._8_4_;
              auVar39._12_4_ = -auVar35._12_4_;
              auVar40 = maxps(auVar39,auVar35);
              auVar36._4_4_ = -(uint)(1e-06 < auVar40._4_4_);
              auVar36._0_4_ = -(uint)(1e-06 < auVar40._0_4_);
              auVar36._8_4_ = -(uint)(1e-06 < auVar40._8_4_);
              auVar36._12_4_ = -(uint)(1e-06 < auVar40._12_4_);
              auVar40 = packssdw(auVar36,auVar36);
              auVar40 = packsswb(auVar40,auVar40);
              uVar22 = auVar40._0_4_ & (uint)DAT_00967bd0;
              if (((((char)uVar22 != '\0') || ((uVar22 >> 8 & 1) != 0)) ||
                  ((uVar22 >> 0x10 & 1) != 0)) || ((uVar22 >> 0x18 & 1) != 0)) {
                if (iVar30 < 8) {
                  local_1d8._0_8_ =
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                  std::__cxx11::ostringstream::ostringstream(poVar1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,"Element at index ",0x11);
                  std::ostream::operator<<(poVar1,iVar31);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1," (tessellation invocation ",0x1a);
                  std::ostream::operator<<(poVar1,iVar13);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,", geometry primitive ",0x15);
                  std::ostream::operator<<(poVar1,(int)fVar33);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,", emitted vertex ",0x11);
                  std::ostream::operator<<(poVar1,iVar27);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"):\n",3);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,
                             "\tfeedback result was not contant over whole primitive.\n",0x37);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,"\tfirst emitted value: ",0x16);
                  tcu::operator<<((ostream *)poVar1,(Vector<float,_4> *)&primitivesGeneratedResult);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)poVar1,"\tcurrent emitted value:",0x17);
                  tcu::operator<<((ostream *)poVar1,&generatedElementVertex);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1d8,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream(poVar1);
                  std::ios_base::~ios_base(local_160);
                }
                tcu::TestContext::setTestResult
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                           QP_TEST_RESULT_FAIL,
                           "got multiple different feedback values for a single primitive");
                iVar30 = iVar30 + 1;
              }
              iVar31 = iVar31 + 1;
              iVar27 = iVar27 + 1;
            } while (iVar27 != iVar11);
          }
          fVar33 = (float)((int)fVar33 + 1);
          iVar27 = iVar30;
        } while (fVar33 != local_58);
      }
      iVar13 = iVar13 + 1;
      iVar30 = getNumTessellatedPrimitives
                         ((FeedbackPrimitiveTypeCase *)(ulong)this->m_tessellationOutput);
    } while (iVar13 < iVar30);
    if (8 < iVar27) {
      local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1d8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Omitted ",8);
      std::ostream::operator<<(poVar1,iVar27 + -8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," error(s).",10);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_160);
    }
  }
  _primitivesGeneratedResult = (TextureFormat)0x0;
  TStack_2a0.order = 0;
  TStack_2a0.type = 0;
  local_298 = 0;
  local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Comparing result image against feedback results.",0x30);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  if (feedbackResults.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)CONCAT44(feedbackResults.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                        (int)feedbackResults.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish)) {
    std::
    __unique_copy<__gnu_cxx::__normal_iterator<tcu::Vector<float,4>const*,std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>>,std::back_insert_iterator<std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
              (feedbackResults.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (pointer)CONCAT44(feedbackResults.
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                 (int)feedbackResults.
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish),
               &primitivesGeneratedResult);
  }
  TVar29 = _primitivesGeneratedResult;
  TVar18 = TStack_2a0;
  if (_primitivesGeneratedResult != TStack_2a0) {
    lVar32 = (long)TStack_2a0 - (long)_primitivesGeneratedResult;
    uVar16 = lVar32 >> 4;
    lVar21 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<tcu::Vector<float,4>*,std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(tcu::Vector<float,4>const&,tcu::Vector<float,4>const&)>>
              ((__normal_iterator<tcu::Vector<float,_4>_*,_std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>_>
                )_primitivesGeneratedResult,
               (__normal_iterator<tcu::Vector<float,_4>_*,_std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>_>
                )TStack_2a0,(ulong)(((uint)lVar21 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_tcu::Vector<float,_4>_&,_const_tcu::Vector<float,_4>_&)>
                )0x5720c3);
    TVar17 = TVar29;
    if (lVar32 < 0x101) {
      while (TVar25 = (TextureFormat)((long)TVar17 + 0x10), TVar25 != TVar18) {
        fVar33 = (float)((TextureFormat *)((long)TVar17 + 0x10))->order;
        if ((fVar33 < *(float *)TVar29) ||
           ((fVar34 = *(float *)((long)TVar17 + 0x14), fVar33 <= *(float *)TVar29 &&
            (fVar34 < *(float *)((long)TVar29 + 4))))) {
          local_1d8._0_8_ = *(undefined8 *)TVar25;
          local_1d8._8_8_ = *(TextureFormat *)((long)TVar17 + 0x18);
          lVar21 = (long)TVar25 - (long)TVar29 >> 4;
          if (0 < lVar21) {
            uVar16 = lVar21 + 1;
            TVar17 = TVar25;
            do {
              *(TextureFormat *)TVar17 = *(TextureFormat *)((long)TVar17 + -0x10);
              *(TextureFormat *)((long)TVar17 + 8) = *(TextureFormat *)((long)TVar17 + -8);
              TVar17 = (TextureFormat)((long)TVar17 + -0x10);
              uVar16 = uVar16 - 1;
            } while (1 < uVar16);
          }
          *(undefined8 *)TVar29 = local_1d8._0_8_;
          *(undefined8 *)((long)TVar29 + 8) = local_1d8._8_8_;
          TVar17 = TVar25;
        }
        else {
          TVar23 = *(TextureFormat *)((long)TVar17 + 0x18);
          if (fVar33 < *(float *)TVar17) goto LAB_00570d22;
          TVar26 = TVar25;
          if (fVar33 <= *(float *)TVar17) {
            fVar2 = *(float *)((long)TVar17 + 4);
            while (fVar34 < fVar2) {
LAB_00570d22:
              do {
                TVar26 = TVar17;
                *(TextureFormat *)((long)TVar26 + 0x10) = *(TextureFormat *)TVar26;
                *(TextureFormat *)((long)TVar26 + 0x18) = *(TextureFormat *)((long)TVar26 + 8);
                TVar17 = (TextureFormat)((long)TVar26 + -0x10);
                fVar2 = (float)((TextureFormat *)((long)TVar26 + -0x10))->order;
              } while (fVar33 < fVar2);
              if (fVar2 < fVar33) break;
              fVar2 = *(float *)((long)TVar26 + -0xc);
            }
          }
          *(float *)TVar26 = fVar33;
          *(float *)((long)TVar26 + 4) = fVar34;
          *(TextureFormat *)((long)TVar26 + 8) = TVar23;
          TVar17 = TVar25;
        }
      }
    }
    else {
      TVar17 = (TextureFormat)((long)TVar29 + 0x100);
      TVar25 = TVar29;
      TVar23 = (TextureFormat)((long)TVar29 + 0x10);
      do {
        fVar33 = (float)((TextureFormat *)((long)TVar25 + 0x10))->order;
        if ((fVar33 < *(float *)TVar29) ||
           ((fVar34 = *(float *)((long)TVar23 + 4), fVar33 <= *(float *)TVar29 &&
            (fVar34 < *(float *)((long)TVar29 + 4))))) {
          local_1d8._0_8_ = *(undefined8 *)TVar23;
          local_1d8._8_8_ = *(TextureFormat *)((long)TVar23 + 8);
          lVar21 = (long)TVar23 - (long)TVar29 >> 4;
          if (0 < lVar21) {
            uVar16 = lVar21 + 1;
            TVar25 = TVar23;
            do {
              *(TextureFormat *)TVar25 = *(TextureFormat *)((long)TVar25 + -0x10);
              *(TextureFormat *)((long)TVar25 + 8) = *(TextureFormat *)((long)TVar25 + -8);
              TVar25 = (TextureFormat)((long)TVar25 + -0x10);
              uVar16 = uVar16 - 1;
            } while (1 < uVar16);
          }
          *(undefined8 *)TVar29 = local_1d8._0_8_;
          *(undefined8 *)((long)TVar29 + 8) = local_1d8._8_8_;
        }
        else {
          TVar26 = *(TextureFormat *)((long)TVar23 + 8);
          if (fVar33 < *(float *)TVar25) goto LAB_00570bc2;
          TVar28 = TVar23;
          if (fVar33 <= *(float *)TVar25) {
            fVar2 = *(float *)((long)TVar25 + 4);
            while (fVar34 < fVar2) {
LAB_00570bc2:
              do {
                TVar28 = TVar25;
                *(TextureFormat *)((long)TVar28 + 0x10) = *(TextureFormat *)TVar28;
                *(TextureFormat *)((long)TVar28 + 0x18) = *(TextureFormat *)((long)TVar28 + 8);
                TVar25 = (TextureFormat)((long)TVar28 + -0x10);
                fVar2 = (float)((TextureFormat *)((long)TVar28 + -0x10))->order;
              } while (fVar33 < fVar2);
              if (fVar2 < fVar33) break;
              fVar2 = *(float *)((long)TVar28 + -0xc);
            }
          }
          *(float *)TVar28 = fVar33;
          *(float *)((long)TVar28 + 4) = fVar34;
          *(TextureFormat *)((long)TVar28 + 8) = TVar26;
        }
        TVar26 = (TextureFormat)((long)TVar23 + 0x10);
        TVar25 = TVar23;
        TVar23 = TVar26;
      } while (TVar26 != TVar17);
      for (; TVar17 != TVar18; TVar17 = (TextureFormat)((long)TVar17 + 0x10)) {
        TVar29 = *(TextureFormat *)TVar17;
        TVar25 = *(TextureFormat *)((long)TVar17 + 8);
        fVar33 = (float)((TextureFormat *)((long)TVar17 + -0x10))->order;
        fVar34 = (float)TVar29.order;
        TVar23 = TVar17;
        if ((fVar34 < fVar33) ||
           ((fVar34 <= fVar33 && ((float)TVar29.type < *(float *)((long)TVar17 + -0xc))))) {
          while( true ) {
            *(TextureFormat *)TVar23 = *(TextureFormat *)((long)TVar23 + -0x10);
            *(TextureFormat *)((long)TVar23 + 8) = *(TextureFormat *)((long)TVar23 + -8);
            fVar33 = (float)((TextureFormat *)((long)TVar23 + -0x20))->order;
            if ((fVar33 <= fVar34) &&
               ((fVar33 < fVar34 || (*(float *)((long)TVar23 + -0x1c) <= (float)TVar29.type))))
            break;
            TVar23 = (TextureFormat)((long)TVar23 + -0x10);
          }
          TVar23 = (TextureFormat)((long)TVar23 + -0x10);
        }
        *(TextureFormat *)TVar23 = TVar29;
        *(TextureFormat *)((long)TVar23 + 8) = TVar25;
      }
    }
  }
  TVar18 = (TextureFormat)
           std::
           __unique<__gnu_cxx::__normal_iterator<tcu::Vector<float,4>*,std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (_primitivesGeneratedResult);
  TVar29 = _primitivesGeneratedResult;
  if (TVar18 != TStack_2a0) {
    TStack_2a0 = TVar18;
  }
  if (0 < (int)((ulong)((long)TVar18 - (long)TVar29) >> 4)) {
    lVar21 = 0;
    do {
      iVar13 = feedbackResult.m_height;
      iVar11 = feedbackResult.m_width;
      uVar3 = *(undefined8 *)((long)TVar29 + lVar21 * 0x10);
      local_58 = (float)feedbackResult.m_width * ((float)uVar3 * 0.5 + 0.5) + 0.5;
      fStack_54 = (float)feedbackResult.m_height * ((float)((ulong)uVar3 >> 0x20) * 0.5 + 0.5) + 0.5
      ;
      uStack_50 = 0;
      uStack_4c = 0;
      fVar33 = floorf(local_58);
      fVar34 = floorf(fStack_54);
      generatedElementVertex.m_data[0] = (float)(int)fVar33;
      generatedElementVertex.m_data[1] = (float)(int)fVar34;
      iVar27 = -2;
      bVar10 = false;
      do {
        if (!bVar10) {
          iVar31 = iVar27 + (int)generatedElementVertex.m_data[1];
          if ((iVar13 <= iVar31) || (iVar31 < 0)) goto LAB_00570ec0;
          lVar32 = -2;
          do {
            iVar30 = (int)generatedElementVertex.m_data[0] + (int)lVar32;
            if ((iVar30 < 0) || (iVar11 <= iVar30)) goto LAB_00570ec0;
            if ((*(uint *)((long)feedbackResult.m_pixels.m_ptr +
                          (long)(iVar31 * iVar11 + (int)generatedElementVertex.m_data[0] +
                                (int)lVar32) * 4) & 0xffffff) != 0) {
              bVar10 = true;
            }
          } while ((lVar32 < 2) && (lVar32 = lVar32 + 1, !bVar10));
        }
      } while ((iVar27 < 2) && (iVar27 = iVar27 + 1, !bVar10));
      if (!bVar10) {
        local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_1d8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Vertex ",7);
        tcu::operator<<((ostream *)poVar1,
                        (Vector<float,_4> *)(lVar21 * 0x10 + (long)_primitivesGeneratedResult));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"\tCould not find rasterization output for vertex.\n",0x31);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"\tExpected non-black pixels near ",0x20);
        tcu::operator<<((ostream *)poVar1,(Vector<int,_2> *)&generatedElementVertex);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_160);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"invalid result image");
        TVar18 = TStack_2a0;
        TVar29 = _primitivesGeneratedResult;
      }
LAB_00570ec0:
      lVar21 = lVar21 + 1;
    } while (lVar21 < (int)((ulong)((long)TVar18 - (long)TVar29) >> 4));
  }
  if (TVar29 != (TextureFormat)0x0) {
    operator_delete((void *)TVar29,local_298 - (long)TVar29);
  }
  if (feedbackResults.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(feedbackResults.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)feedbackResults.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)feedbackResults.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  glu::ObjectWrapper::~ObjectWrapper(&primitivesGeneratedQuery.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar21 = CONCAT44(extraout_var_02,iVar11);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  pOVar14 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)&primitivesGeneratedResult,
             (Functions *)CONCAT44(extraout_var_03,iVar11),pOVar14);
  iVar11 = (**(code **)(lVar21 + 0x780))
                     ((this->m_nonFeedbackProgram->m_program).m_program,"a_position");
  if (iVar11 == -1) {
    pTVar20 = (TestError *)__cxa_allocate_exception(0x38);
    local_1d8._0_8_ = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"a_position was -1","");
    tcu::TestError::TestError(pTVar20,(string *)local_1d8);
    __cxa_throw(pTVar20,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Rendering without transform feedback",0x24);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  (**(code **)(lVar21 + 0x1a00))(0,0,nonFeedbackResult.m_width,nonFeedbackResult.m_height);
  (**(code **)(lVar21 + 0x1c0))(0);
  (**(code **)(lVar21 + 0x188))(0x4000);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"clear",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x471);
  (**(code **)(lVar21 + 0xd8))(local_298 & 0xffffffff);
  (**(code **)(lVar21 + 0x40))(0x8892,this->m_patchBuffer);
  (**(code **)(lVar21 + 0x19f0))(iVar11,4,0x1406,0,0,0);
  (**(code **)(lVar21 + 0x610))(iVar11);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"setup attribs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x477);
  (**(code **)(lVar21 + 0x1680))((this->m_nonFeedbackProgram->m_program).m_program);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x47a);
  (**(code **)(lVar21 + 0xfd8))(0x8e72,4);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"set patch param",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x47d);
  local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Calling drawArrays with mode GL_PATCHES",0x27);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  (**(code **)(lVar21 + 0x538))(0xe,0,4);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"draw patches",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x482);
  pRVar7 = ((this->super_TestCase).m_context)->m_renderCtx;
  vao.super_ObjectWrapper.m_gl = (Functions *)0x300000008;
  pvVar15 = (void *)nonFeedbackResult.m_pixels.m_cap;
  if (nonFeedbackResult.m_pixels.m_cap != 0) {
    pvVar15 = nonFeedbackResult.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1d8,(TextureFormat *)&vao,nonFeedbackResult.m_width,
             nonFeedbackResult.m_height,1,pvVar15);
  glu::readPixels(pRVar7,0,0,(PixelBufferAccess *)local_1d8);
  dVar12 = (**(code **)(lVar21 + 0x800))();
  glu::checkError(dVar12,"readPixels",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationGeometryInteractionTests.cpp"
                  ,0x485);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)&primitivesGeneratedResult);
  local_1d8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,
             "Comparing the image rendered with no transform feedback against the image rendered with enabled transform feedback."
             ,0x73);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  pRVar19 = Context::getRenderTarget((this->super_TestCase).m_context);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  if (pRVar19->m_numSamples < 2) {
    _primitivesGeneratedResult = (TextureFormat)0x300000008;
    if (feedbackResult.m_pixels.m_cap != 0) {
      feedbackResult.m_pixels.m_cap = (size_t)feedbackResult.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1d8,(TextureFormat *)&primitivesGeneratedResult,
               feedbackResult.m_width,feedbackResult.m_height,1,
               (void *)feedbackResult.m_pixels.m_cap);
    vao.super_ObjectWrapper.m_gl = (Functions *)0x300000008;
    if (nonFeedbackResult.m_pixels.m_cap != 0) {
      nonFeedbackResult.m_pixels.m_cap = (size_t)nonFeedbackResult.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&primitivesGeneratedResult,(TextureFormat *)&vao,
               nonFeedbackResult.m_width,nonFeedbackResult.m_height,1,
               (void *)nonFeedbackResult.m_pixels.m_cap);
    vao.super_ObjectWrapper.m_gl = (Functions *)0x800000008;
    vao.super_ObjectWrapper.m_traits = (ObjectTraits *)0xff00000008;
    primitivesGeneratedQuery.super_ObjectWrapper.m_gl = (Functions *)0x100000001;
    primitivesGeneratedQuery.super_ObjectWrapper.m_traits._0_4_ = 0;
    bVar10 = tcu::intThresholdPositionDeviationCompare
                       (log,"ImageCompare","Image comparison",(ConstPixelBufferAccess *)local_1d8,
                        (ConstPixelBufferAccess *)&primitivesGeneratedResult,(UVec4 *)&vao,
                        (IVec3 *)&primitivesGeneratedQuery.super_ObjectWrapper,true,
                        COMPARE_LOG_RESULT);
  }
  else {
    _primitivesGeneratedResult = (TextureFormat)0x300000008;
    if (feedbackResult.m_pixels.m_cap != 0) {
      feedbackResult.m_pixels.m_cap = (size_t)feedbackResult.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1d8,(TextureFormat *)&primitivesGeneratedResult,
               feedbackResult.m_width,feedbackResult.m_height,1,
               (void *)feedbackResult.m_pixels.m_cap);
    vao.super_ObjectWrapper.m_gl = (Functions *)0x300000008;
    if (nonFeedbackResult.m_pixels.m_cap != 0) {
      nonFeedbackResult.m_pixels.m_cap = (size_t)nonFeedbackResult.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&primitivesGeneratedResult,(TextureFormat *)&vao,
               nonFeedbackResult.m_width,nonFeedbackResult.m_height,1,
               (void *)nonFeedbackResult.m_pixels.m_cap);
    bVar10 = tcu::fuzzyCompare(log,"ImageCompare","Image comparison",
                               (ConstPixelBufferAccess *)local_1d8,
                               (ConstPixelBufferAccess *)&primitivesGeneratedResult,0.03,
                               COMPARE_LOG_RESULT);
  }
  if (bVar10 == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  tcu::Surface::~Surface(&nonFeedbackResult);
  tcu::Surface::~Surface(&feedbackResult);
  return STOP;
}

Assistant:

FeedbackPrimitiveTypeCase::IterateResult FeedbackPrimitiveTypeCase::iterate (void)
{
	tcu::Surface feedbackResult		(RENDER_SIZE, RENDER_SIZE);
	tcu::Surface nonFeedbackResult	(RENDER_SIZE, RENDER_SIZE);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// render with and without XFB
	renderWithFeedback(feedbackResult);
	renderWithoutFeedback(nonFeedbackResult);

	// compare
	{
		bool imageOk;

		m_testCtx.getLog() << tcu::TestLog::Message << "Comparing the image rendered with no transform feedback against the image rendered with enabled transform feedback." << tcu::TestLog::EndMessage;

		if (m_context.getRenderTarget().getNumSamples() > 1)
			imageOk = tcu::fuzzyCompare(m_testCtx.getLog(),
										"ImageCompare",
										"Image comparison",
										feedbackResult.getAccess(),
										nonFeedbackResult.getAccess(),
										0.03f,
										tcu::COMPARE_LOG_RESULT);
		else
			imageOk = tcu::intThresholdPositionDeviationCompare(m_testCtx.getLog(),
																"ImageCompare",
																"Image comparison",
																feedbackResult.getAccess(),
																nonFeedbackResult.getAccess(),
																tcu::UVec4(8, 8, 8, 255),						//!< threshold
																tcu::IVec3(1, 1, 0),							//!< 3x3 search kernel
																true,											//!< fragments may end up over the viewport, just ignore them
																tcu::COMPARE_LOG_RESULT);

		if (!imageOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}

	return STOP;
}